

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_del_subregion_tricore(MemoryRegion_conflict *mr,MemoryRegion_conflict *subregion)

{
  MemoryRegion_conflict *subregion_local;
  MemoryRegion_conflict *mr_local;
  
  memory_region_transaction_begin_tricore();
  if (subregion->container == mr) {
    subregion->container = (MemoryRegion_conflict *)0x0;
    if ((subregion->subregions_link).tqe_next == (MemoryRegion *)0x0) {
      (mr->subregions).tqh_circ.tql_prev = (subregion->subregions_link).tqe_circ.tql_prev;
    }
    else {
      (((subregion->subregions_link).tqe_next)->subregions_link).tqe_circ.tql_prev =
           (subregion->subregions_link).tqe_circ.tql_prev;
    }
    ((subregion->subregions_link).tqe_circ.tql_prev)->tql_next =
         (subregion->subregions_link).tqe_next;
    (subregion->subregions_link).tqe_circ.tql_prev = (QTailQLink *)0x0;
    (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
    (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
    mr->uc->memory_region_update_pending = true;
    memory_region_transaction_commit_tricore(mr);
    return;
  }
  __assert_fail("subregion->container == mr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                ,0x4f9,"void memory_region_del_subregion_tricore(MemoryRegion *, MemoryRegion *)");
}

Assistant:

void memory_region_del_subregion(MemoryRegion *mr,
                                 MemoryRegion *subregion)
{
    memory_region_transaction_begin();
    assert(subregion->container == mr);
    subregion->container = NULL;
    QTAILQ_REMOVE(&mr->subregions, subregion, subregions_link);
    mr->uc->memory_region_update_pending = true;
    memory_region_transaction_commit(mr);
}